

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O3

Clause * __thiscall Shell::EqualityProxyMono::apply(EqualityProxyMono *this,Clause *cl)

{
  Literal **ppLVar1;
  Literal ***pppLVar2;
  Literal *lit;
  Unit *pUVar3;
  bool bVar4;
  Self SVar5;
  uint uVar6;
  uint uVar7;
  Literal *pLVar8;
  Literal **ppLVar9;
  Entry *pEVar10;
  Entry *pEVar11;
  Clause *pCVar12;
  undefined8 *puVar13;
  ulong uVar14;
  bool bVar15;
  Literal **ppLVar16;
  Unit **ppUVar17;
  undefined8 *puVar18;
  uint uVar19;
  RStack<Literal_*> resLits;
  Stack<Kernel::Unit_*> local_e8;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_c0;
  EqualityProxyMono *local_b0;
  NonspecificInference2 local_a8;
  Inference local_90;
  Inference local_60;
  
  local_e8._cursor = (Unit **)0x0;
  local_e8._end = (Unit **)0x0;
  local_e8._capacity = 0;
  local_e8._stack = (Unit **)0x0;
  local_b0 = this;
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_c0);
  uVar6 = *(uint *)&cl->field_0x38 & 0xfffff;
  if (uVar6 != 0) {
    ppLVar1 = cl->_literals;
    uVar7 = 1;
    bVar15 = false;
    ppLVar9 = ppLVar1;
    do {
      ppLVar16 = ppLVar1 + (int)uVar7;
      uVar19 = uVar7;
      while( true ) {
        lit = *ppLVar9;
        pLVar8 = apply(local_b0,lit);
        SVar5._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
             local_c0._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
             .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
        ppLVar9 = *(Literal ***)
                   ((long)local_c0._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl + 0x10);
        if (ppLVar9 ==
            *(Literal ***)
             ((long)local_c0._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
             0x18)) {
          Lib::Stack<Kernel::Literal_*>::expand
                    ((Stack<Kernel::Literal_*> *)
                     local_c0._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
          ppLVar9 = *(Literal ***)
                     ((long)SVar5._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                            _M_head_impl + 0x10);
        }
        *ppLVar9 = pLVar8;
        pppLVar2 = (Literal ***)
                   ((long)SVar5._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl + 0x10);
        *pppLVar2 = *pppLVar2 + 1;
        if (pLVar8 != lit) break;
        ppLVar9 = ppLVar1 + (int)uVar19;
        ppLVar16 = ppLVar16 + 1;
        bVar4 = uVar6 <= uVar19;
        uVar19 = uVar19 + 1;
        if (bVar4) {
          if (!bVar15) goto LAB_006d078f;
          goto LAB_006d06a6;
        }
      }
      local_a8._0_4_ = (pLVar8->super_Term)._functor;
      pEVar10 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                findEntry(&s_proxyPredicateSorts,(uint *)&local_a8);
      local_a8._0_8_ = (pEVar10->_val)._content;
      pEVar11 = Lib::DHMap<Kernel::TermList,_Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
                findEntry(&s_proxyPremises,(TermList *)&local_a8);
      pUVar3 = pEVar11->_val;
      if (local_e8._cursor == local_e8._end) {
        Lib::Stack<Kernel::Unit_*>::expand(&local_e8);
      }
      *local_e8._cursor = pUVar3;
      local_e8._cursor = local_e8._cursor + 1;
      uVar7 = (uVar19 < uVar6) + uVar19;
      bVar15 = true;
      ppLVar9 = ppLVar16;
    } while (uVar19 < uVar6);
LAB_006d06a6:
    if ((long)local_e8._cursor - (long)local_e8._stack == 8) {
      local_a8.premise2 = local_e8._cursor[-1];
      local_a8.rule = 0x6d;
      local_a8.premise1 = &cl->super_Unit;
      Kernel::Inference::Inference(&local_60,&local_a8);
      pCVar12 = Kernel::Clause::fromStack
                          ((Stack<Kernel::Literal_*> *)
                           local_c0._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                           _M_head_impl,&local_60);
    }
    else {
      if (local_e8._stack == local_e8._cursor) {
        puVar13 = (undefined8 *)0x0;
      }
      else {
        ppUVar17 = local_e8._cursor;
        puVar18 = (undefined8 *)0x0;
        do {
          pUVar3 = ppUVar17[-1];
          puVar13 = (undefined8 *)
                    Lib::FixedSizeAllocator<16UL>::alloc
                              ((FixedSizeAllocator<16UL> *)
                               (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
          ppUVar17 = ppUVar17 + -1;
          *puVar13 = pUVar3;
          puVar13[1] = puVar18;
          puVar18 = puVar13;
        } while (ppUVar17 != local_e8._stack);
      }
      local_a8.premise1 =
           (Unit *)Lib::FixedSizeAllocator<16UL>::alloc
                             ((FixedSizeAllocator<16UL> *)
                              (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      *(Clause **)&((Clause *)local_a8.premise1)->super_Unit = cl;
      *(undefined8 **)&(((Clause *)local_a8.premise1)->super_Unit)._inference = puVar13;
      local_a8.rule = 0x6d;
      Kernel::Inference::Inference(&local_90,(NonspecificInferenceMany *)&local_a8);
      pCVar12 = Kernel::Clause::fromStack
                          ((Stack<Kernel::Literal_*> *)
                           local_c0._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                           _M_head_impl,&local_90);
    }
    (pCVar12->super_Unit)._inference._age = (cl->super_Unit)._inference._age;
    cl = pCVar12;
  }
LAB_006d078f:
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_c0);
  if (local_e8._stack != (Unit **)0x0) {
    uVar14 = local_e8._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar14 == 0) {
      *local_e8._stack = (Unit *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_e8._stack;
    }
    else if (uVar14 < 0x11) {
      *local_e8._stack = (Unit *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_e8._stack;
    }
    else if (uVar14 < 0x19) {
      *local_e8._stack = (Unit *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_e8._stack;
    }
    else if (uVar14 < 0x21) {
      *local_e8._stack = (Unit *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_e8._stack;
    }
    else if (uVar14 < 0x31) {
      *local_e8._stack = (Unit *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_e8._stack;
    }
    else if (uVar14 < 0x41) {
      *local_e8._stack = (Unit *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_e8._stack;
    }
    else {
      operator_delete(local_e8._stack,0x10);
    }
  }
  return cl;
}

Assistant:

Clause* EqualityProxyMono::apply(Clause* cl)
{
  UnitStack proxyPremises;
  RStack<Literal*> resLits;

  bool modified = false;
  for (Literal* lit : cl->iterLits()) {
    Literal* rlit=apply(lit);
    resLits->push(rlit);
    if (rlit != lit) {
      ASS(lit->isEquality());
      modified = true;
      TermList srt = s_proxyPredicateSorts.get(rlit->functor());
      Unit* prem = s_proxyPremises.get(srt);
      proxyPremises.push(prem);
    }
  }
  if (!modified) {
    return cl;
  }

  Clause* res;
  ASS(proxyPremises.isNonEmpty());
  if (proxyPremises.size() == 1) {
    res = Clause::fromStack(*resLits,
        NonspecificInference2(InferenceRule::EQUALITY_PROXY_REPLACEMENT, cl, proxyPremises.top()));
  }
  else {
    UnitList* prems = 0;
    UnitList::pushFromIterator(UnitStack::ConstIterator(proxyPremises),prems);
    UnitList::push(cl,prems);

    res = Clause::fromStack(*resLits,
        NonspecificInferenceMany(InferenceRule::EQUALITY_PROXY_REPLACEMENT, prems));
  }
  // TODO isn't this done atomatically
  res->setAge(cl->age()); // MS: this seems useless; as long as EqualityProxy is only operating as a part of preprocessing, age is going to 0 anyway

  return res;
}